

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::SmallInteger::stIntegerDivide(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  if ((((uVar2 & 1) == 0) || ((uVar3 & 1) == 0)) || (CONCAT44(extraout_var_01,uVar3) < 2)) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar7 = CONCAT44(extraout_var_00,uVar2) >> 1;
  uVar6 = (long)CONCAT44(extraout_var_01,uVar3) >> 1;
  if ((long)uVar7 < 0) {
    uVar5 = (uVar7 - uVar6) + 1;
    if ((long)uVar6 < 1) {
      uVar5 = uVar7;
    }
  }
  else {
    if (0 < (long)uVar6) {
      uVar4 = uVar7 / uVar6;
      uVar7 = uVar7 % uVar6;
      goto LAB_001405c0;
    }
    uVar5 = (uVar6 - uVar7) + 1;
  }
  uVar4 = (long)uVar5 / (long)uVar6;
  uVar7 = (long)uVar5 % (long)uVar6;
LAB_001405c0:
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x16])
                    (interpreter,uVar4,uVar7,interpreter->_vptr_InterpreterProxy[0x16]);
  return iVar1;
}

Assistant:

int SmallInteger::stIntegerDivide(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isSmallInteger() || !b.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = a.decodeSmallInteger();
    auto ib = b.decodeSmallInteger();
    if (ib == 0)
        return interpreter->primitiveFailed();
    return interpreter->returnInteger(divideRoundNeg(ia, ib));
}